

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void __thiscall
spatial_region::fout_bz(spatial_region *this,ofstream *pfout,int n0,int n,openmode mode)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  int j;
  long lVar5;
  int k;
  long lVar6;
  
  if ((mode & ~_S_app) == (_S_out|_S_bin)) {
    write_binary<cellb>(pfout,&this->cb,getbz,n0,n,this->ny,this->nz);
  }
  else {
    if ((mode & ~_S_app) != _S_out) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"fout_bz: ERROR: wrong mode");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    lVar4 = (long)n0;
    while( true ) {
      if (n <= lVar4) break;
      iVar1 = this->nz;
      for (lVar5 = 0; iVar2 = this->ny, lVar5 < iVar2; lVar5 = lVar5 + 1) {
        poVar3 = std::ostream::_M_insert<double>
                           ((this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar4][lVar5]
                            [iVar1 / 2].bz);
        std::operator<<(poVar3,"\n");
      }
      lVar5 = 0x10;
      for (lVar6 = 0; lVar6 < this->nz; lVar6 = lVar6 + 1) {
        poVar3 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(this->cb).p._M_t.
                                     super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>
                                     .super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar4]
                                     [iVar2 / 2]->bx + lVar5));
        std::operator<<(poVar3,"\n");
        lVar5 = lVar5 + 0x18;
      }
      lVar4 = lVar4 + 1;
    }
  }
  return;
}

Assistant:

void spatial_region::fout_bz(ofstream* pfout, int n0, int n, ios_base::openmode
        mode)
{
    /* n-n0 - длина массива по x (для данного spatial_region'а) для
     * вывода сечения плоскостью xy и плоскостью xz */
    if (is_mode_non_binary(mode)) {
        for(int i=n0;i<n;i++)
        {
            int k=nz/2;
            for(int j=0;j<ny;j++)
                (*pfout)<<cb[i][j][k].bz<<"\n";
            int j=ny/2;
            for(int k=0;k<nz;k++)
                (*pfout)<<cb[i][j][k].bz<<"\n";
        }
    } else if (is_mode_binary(mode)) {
        write_binary<cellb>(pfout, cb, getbz, n0, n, ny, nz);
    } else {
        cerr << "fout_bz: ERROR: wrong mode" << endl;
    }
}